

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall dynet::Trainer::update(Trainer *this,real scale)

{
  uint uVar1;
  uint *puVar2;
  _Hash_node_base *p_Var3;
  uint *puVar4;
  ulong uVar5;
  Model *pMVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var [60];
  
  if (this->aux_allocated == false) {
    (*this->_vptr_Trainer[2])(this);
    this->aux_allocated = true;
  }
  auVar8._0_4_ = clip_gradients(this,scale);
  auVar8._4_60_ = extraout_var;
  pMVar6 = this->model;
  puVar4 = (pMVar6->updated_params).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pMVar6->updated_params).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 == puVar2) {
    auVar9 = ZEXT1664(auVar8._0_16_);
  }
  else {
    do {
      uVar1 = *puVar4;
      (*this->_vptr_Trainer[4])((ulong)(uint)scale,(ulong)(uint)auVar8._0_4_,this,(ulong)uVar1);
      ParameterStorage::clear
                ((pMVar6->params).
                 super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar1]);
      auVar9 = ZEXT464((uint)auVar8._0_4_);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
    pMVar6 = this->model;
  }
  puVar4 = (pMVar6->updated_lookup_params).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pMVar6->updated_lookup_params).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 != puVar2) {
    do {
      uVar5 = (ulong)*puVar4;
      if (this->sparse_updates_enabled == true) {
        for (p_Var3 = ((pMVar6->lookup_params).
                       super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar5]->non_zero_grads)._M_h.
                      _M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
            p_Var3 = p_Var3->_M_nxt) {
          (*this->_vptr_Trainer[5])
                    ((ulong)(uint)scale,(ulong)(uint)auVar8._0_4_,this,uVar5,
                     (ulong)*(uint *)&p_Var3[1]._M_nxt);
        }
      }
      else {
        (*this->_vptr_Trainer[6])((ulong)(uint)scale,auVar9._0_8_,this,uVar5);
      }
      LookupParameterStorage::clear
                ((pMVar6->lookup_params).
                 super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5]);
      auVar9 = ZEXT464((uint)auVar8._0_4_);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
    pMVar6 = this->model;
  }
  this->updates = this->updates + 1.0;
  this->updates_since_status = this->updates_since_status + 1.0;
  auVar7 = ZEXT416((uint)(pMVar6->weight_decay).weight_decay);
  auVar7 = vfnmadd132ss_fma(auVar7,auVar7,ZEXT416((uint)(pMVar6->weight_decay).lambda));
  (pMVar6->weight_decay).weight_decay = auVar7._0_4_;
  if (auVar7._0_4_ < 0.25) {
    rescale_and_reset_weight_decay(this);
    return;
  }
  return;
}

Assistant:

void Trainer::update(real scale) {
  // Allocate if necessary
  if(!aux_allocated) {
    alloc_impl();
    aux_allocated = true;
  }

  // Perform gradient clipping and cycle through parameters
  const float gscale = clip_gradients(scale);
  const auto & params = model->parameters_list();
  const auto & upd_params = model->updated_parameters_list();
  for(auto i : upd_params) {
    update_params(scale, gscale, i);
    params[i]->clear();
  }
  const auto & lookup_params = model->lookup_parameters_list();
  const auto & upd_lookup_params = model->updated_lookup_parameters_list();
  for(auto i : upd_lookup_params) {
    if(sparse_updates_enabled) {
      for (auto j : lookup_params[i]->non_zero_grads)
        update_lookup_params(scale, gscale, i, j);
    } else {
      update_lookup_params(scale, gscale, i);
    }
    lookup_params[i]->clear();
  }
  ++updates;
  ++updates_since_status;

  model->weight_decay.update_weight_decay(); // update global weight scale
  if (model->weight_decay.parameters_need_rescaled())
    rescale_and_reset_weight_decay();  // if wdscale is getting to small multiply all weights by wdscale, and set wdscale to 1
}